

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void Js::Profiler::ForEachNode<Js::Profiler::Print(Js::Phase)::__0>
               (Phase tag,TypeNode *node,anon_class_32_4_bc7babac visit,Phase parentTag)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TreeNode<Js::UnitData,_373> *node_00;
  TypeNode *child;
  int i;
  Phase parentTag_local;
  TypeNode *node_local;
  Phase tag_local;
  
  if (node == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0x1ad,"(node != 0)","Invalid usage: node must always be non null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  for (child._0_4_ = 0; (int)(uint)child < 0x175; child._0_4_ = (uint)child + 1) {
    bVar2 = TreeNode<Js::UnitData,_373>::ChildExistsAt(node,(uint)child);
    if (bVar2) {
      node_00 = TreeNode<Js::UnitData,_373>::GetChildAt(node,(uint)child);
      if ((uint)child == tag) {
        Print::anon_class_32_4_bc7babac::operator()(&visit,node_00,parentTag);
      }
      else {
        ForEachNode<Js::Profiler::Print(Js::Phase)::__0>(tag,node_00,visit,(Phase)(uint)child);
      }
    }
  }
  return;
}

Assistant:

void
    Profiler::ForEachNode(Phase tag, TypeNode *node, FVisit visit, Phase parentTag)
    {
        AssertMsg(node != NULL, "Invalid usage: node must always be non null");

        for(int i = 0; i < PhaseCount; i++)
        {
            if(node->ChildExistsAt(i))
            {
                TypeNode * child = node->GetChildAt(i);
                if(i == tag)
                {
                    visit(child, parentTag);
                }
                else
                {
                    ForEachNode(tag, child, visit, static_cast<Phase>(i));
                }
            }
        }
    }